

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void check_config(vector_t *cfg)

{
  anon_class_8_1_ba1d3bc4 *in_stack_00000050;
  anon_class_8_1_ba1d3bc4 *in_stack_00000060;
  anon_class_8_1_ba1d3bc4 *in_stack_00000070;
  anon_class_8_1_ba1d3bc4 *in_stack_00000080;
  
  check_config::anon_class_8_1_ba1d3bc4::operator()(in_stack_00000070);
  check_config::anon_class_8_1_ba1d3bc4::operator()(in_stack_00000070);
  check_config::anon_class_8_1_ba1d3bc4::operator()(in_stack_00000050);
  check_config::anon_class_8_1_ba1d3bc4::operator()(in_stack_00000070);
  check_config::anon_class_8_1_ba1d3bc4::operator()(in_stack_00000070);
  check_config::anon_class_8_1_ba1d3bc4::operator()(in_stack_00000070);
  check_config::anon_class_8_1_ba1d3bc4::operator()(in_stack_00000070);
  check_config::anon_class_8_1_ba1d3bc4::operator()(in_stack_00000070);
  check_config::anon_class_8_1_ba1d3bc4::operator()(in_stack_00000070);
  check_config::anon_class_8_1_ba1d3bc4::operator()(in_stack_00000070);
  check_config::anon_class_8_1_ba1d3bc4::operator()(in_stack_00000070);
  check_config::anon_class_8_1_ba1d3bc4::operator()(in_stack_00000070);
  check_config::anon_class_8_1_ba1d3bc4::operator()(in_stack_00000060);
  check_config::anon_class_8_1_ba1d3bc4::operator()(in_stack_00000080);
  check_config::anon_class_8_1_ba1d3bc4::operator()(in_stack_00000070);
  check_config::anon_class_8_1_ba1d3bc4::operator()(in_stack_00000070);
  check_config::anon_class_8_1_ba1d3bc4::operator()(in_stack_00000070);
  check_config::anon_class_8_1_ba1d3bc4::operator()(in_stack_00000070);
  return;
}

Assistant:

void check_config( const cfg::vector_t & cfg )
{
	REQUIRE( cfg.vector().size() == 1 );
	REQUIRE( cfg.vector().at( 0 ).string_field() == "one" );
	REQUIRE( cfg.vector().at( 0 ).no_value_field() == true );
	REQUIRE( cfg.vector().at( 0 ).int_field().size() == 2 );
	REQUIRE( cfg.vector().at( 0 ).int_field().at( 0 ) == 100 );
	REQUIRE( cfg.vector().at( 0 ).int_field().at( 1 ) == 200 );
	REQUIRE( cfg.vector().at( 0 ).custom_field().m_value == 300 );

	REQUIRE( cfg.vector().at( 0 ).bool_scalar().bool_scalar() == true );
	REQUIRE( cfg.vector().at( 0 ).bool_scalar().string_field() == "one" );

	REQUIRE( cfg.vector().at( 0 ).int_scalar().int_scalar() == 100 );
	REQUIRE( cfg.vector().at( 0 ).int_scalar().string_field() == "one\n\"\r\t\\" );

	REQUIRE( cfg.vector().at( 0 ).string_scalar().string_scalar() == "string" );
	REQUIRE( cfg.vector().at( 0 ).string_scalar().string_field().isEmpty() );

	REQUIRE( cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().size() == 3 );
	REQUIRE( cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().at( 0 ) == 100 );
	REQUIRE( cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().at( 1 ) == 200 );
	REQUIRE( cfg.vector().at( 0 ).int_scalar_vector().int_scalar_vector().at( 2 ) == 300 );
	REQUIRE( cfg.vector().at( 0 ).int_scalar_vector().string_field() ==
		"StringStringStringStringStringStringStringString"
		"StringStringStringStringStringStringStringString"
		"StringStringStringString" );
}